

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoMesh::CreateGeoElement
          (TPZGeoMesh *this,MElementType type,TPZVec<long> *nodeindexes,int matid,int64_t *index,
          int reftype)

{
  ostream *poVar1;
  void *pvVar2;
  ulong uVar3;
  uint in_ESI;
  int in_R9D;
  TPZGeoElRefPattern<pzgeom::TPZGeoCube> *gel_7;
  TPZGeoElRefPattern<pzgeom::TPZGeoPrism> *gel_6;
  TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *gel_5;
  TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *gel_4;
  TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *gel_3;
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *gel_2;
  TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *gel_1;
  TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *gel;
  int64_t *in_stack_ffffffffffffff00;
  TPZGeoMesh *in_stack_ffffffffffffff08;
  int64_t *in_stack_ffffffffffffff10;
  TPZGeoMesh *in_stack_ffffffffffffff18;
  TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *in_stack_ffffffffffffff20;
  TPZVec<long> *in_stack_ffffffffffffff28;
  TPZGeoElRefPattern<pzgeom::TPZGeoCube> *in_stack_ffffffffffffff30;
  TPZGeoMesh *local_8;
  
  if (in_R9D == 0) {
    switch(in_ESI) {
    case 0:
      local_8 = (TPZGeoMesh *)operator_new(0x70);
      TPZGeoElement<pzgeom::TPZGeoPoint,_pzrefine::TPZRefPoint>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoPoint,_pzrefine::TPZRefPoint> *)
                 in_stack_ffffffffffffff20,(TPZVec<long> *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    case 1:
      local_8 = (TPZGeoMesh *)operator_new(0xb0);
      TPZGeoElement<pzgeom::TPZGeoLinear,_pzrefine::TPZRefLinear>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoLinear,_pzrefine::TPZRefLinear> *)
                 in_stack_ffffffffffffff20,(TPZVec<long> *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    case 2:
      local_8 = (TPZGeoMesh *)operator_new(0x128);
      TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle> *)
                 in_stack_ffffffffffffff20,(TPZVec<long> *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    case 3:
      local_8 = (TPZGeoMesh *)operator_new(0x160);
      TPZGeoElement<pzgeom::TPZGeoQuad,_pzrefine::TPZRefQuad>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoQuad,_pzrefine::TPZRefQuad> *)
                 in_stack_ffffffffffffff20,(TPZVec<long> *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    case 4:
      local_8 = (TPZGeoMesh *)operator_new(0x200);
      TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra> *)
                 in_stack_ffffffffffffff20,(TPZVec<long> *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    case 5:
      local_8 = (TPZGeoMesh *)operator_new(0x288);
      TPZGeoElement<pzgeom::TPZGeoPyramid,_pzrefine::TPZRefPyramid>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoPyramid,_pzrefine::TPZRefPyramid> *)
                 in_stack_ffffffffffffff20,(TPZVec<long> *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    case 6:
      local_8 = (TPZGeoMesh *)operator_new(0x2b0);
      TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism> *)
                 in_stack_ffffffffffffff20,(TPZVec<long> *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    case 7:
      local_8 = (TPZGeoMesh *)operator_new(0x350);
      TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube>::TPZGeoElement
                (in_stack_ffffffffffffff20,(TPZVec<long> *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
      break;
    default:
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "TPZGeoMesh::CreateGeoElement type element not exists:");
      poVar1 = std::operator<<(poVar1," type = ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,in_ESI);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      local_8 = (TPZGeoMesh *)0x0;
    }
  }
  else {
    uVar3 = (ulong)in_ESI;
    switch(uVar3) {
    case 0:
      local_8 = (TPZGeoMesh *)operator_new(0x90);
      TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(int)(uVar3 >> 0x20),local_8,in_stack_ffffffffffffff10);
      break;
    case 1:
      local_8 = (TPZGeoMesh *)operator_new(200);
      TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(int)(uVar3 >> 0x20),in_stack_ffffffffffffff18,
                 (int64_t *)local_8);
      break;
    case 2:
      local_8 = (TPZGeoMesh *)operator_new(0x130);
      TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(int)(uVar3 >> 0x20),in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10);
      break;
    case 3:
      local_8 = (TPZGeoMesh *)operator_new(0x168);
      TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(int)(uVar3 >> 0x20),in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10);
      break;
    case 4:
      local_8 = (TPZGeoMesh *)operator_new(0x1f8);
      TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(int)(uVar3 >> 0x20),in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10);
      break;
    case 5:
      local_8 = (TPZGeoMesh *)operator_new(0x260);
      TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(int)(uVar3 >> 0x20),in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10);
      break;
    case 6:
      local_8 = (TPZGeoMesh *)operator_new(0x298);
      TPZGeoElRefPattern<pzgeom::TPZGeoPrism>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPrism> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(int)(uVar3 >> 0x20),in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10);
      break;
    case 7:
      local_8 = (TPZGeoMesh *)operator_new(0x338);
      TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(int)(uVar3 >> 0x20),
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      break;
    default:
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "TPZGeoMesh::CreateGeoElement type element not exists:");
      poVar1 = std::operator<<(poVar1," type = ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,in_ESI);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      local_8 = (TPZGeoMesh *)0x0;
    }
  }
  return (TPZGeoEl *)local_8;
}

Assistant:

TPZGeoEl *TPZGeoMesh::CreateGeoElement(MElementType type,
                                       TPZVec<int64_t>& nodeindexes,
                                       int matid,
                                       int64_t& index,
                                       int reftype){
    
#ifdef PZDEBUG
    {
        for (int i=0; i<nodeindexes.size(); i++) {
            if (nodeindexes[i] < 0) {
                DebugStop();
            }
        }
    }
#endif
	if (reftype == 0)
    {
        switch( type )
        {
            case 0://point
                return new TPZGeoElement< TPZGeoPoint, TPZRefPoint>(nodeindexes, matid, *this, index );
            case 1://line
                return new TPZGeoElement< TPZGeoLinear, TPZRefLinear>(nodeindexes, matid, *this, index );
            case 2://triangle
                return new TPZGeoElement< TPZGeoTriangle, TPZRefTriangle >(nodeindexes, matid, *this, index );
            case 3://quadrilatera
                return  new TPZGeoElement< TPZGeoQuad, TPZRefQuad >(nodeindexes, matid, *this, index );
            case 4://tetraedra
                return new TPZGeoElement< TPZGeoTetrahedra, TPZRefTetrahedra >(nodeindexes, matid, *this, index );
            case 5:
                return new TPZGeoElement< TPZGeoPyramid, TPZRefPyramid >(nodeindexes, matid, *this, index );
            case 6:
                return new TPZGeoElement< TPZGeoPrism, TPZRefPrism >(nodeindexes, matid, *this, index );
            case 7:
                return new TPZGeoElement< TPZGeoCube, TPZRefCube >(nodeindexes, matid, *this, index );
            default:
                PZError << "TPZGeoMesh::CreateGeoElement type element not exists:"
                << " type = " << type << std::endl;
                return NULL;
        }
    }
	else
	{
		//TPZAutoPointer<TPZRefPattern> ref = GetUniformPattern(type);
		switch( type )
		{
			case 0://point
			{
				TPZGeoElRefPattern<TPZGeoPoint> * gel = new TPZGeoElRefPattern<TPZGeoPoint> (nodeindexes, matid, *this, index);
				return gel;
			}
			case 1://line
			{
				TPZGeoElRefPattern < TPZGeoLinear > *gel = new TPZGeoElRefPattern < TPZGeoLinear >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 2://triangle
			{
				TPZGeoElRefPattern < TPZGeoTriangle > *gel = new TPZGeoElRefPattern < TPZGeoTriangle >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 3://quadrilatera
			{
				TPZGeoElRefPattern < TPZGeoQuad > * gel = new TPZGeoElRefPattern < TPZGeoQuad >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 4://tetraedra
			{
				TPZGeoElRefPattern < TPZGeoTetrahedra > *gel = new TPZGeoElRefPattern < TPZGeoTetrahedra >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 5://pyramid
			{
				TPZGeoElRefPattern < TPZGeoPyramid > *gel = new TPZGeoElRefPattern < TPZGeoPyramid >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 6://prism
			{
				TPZGeoElRefPattern < TPZGeoPrism > *gel = new TPZGeoElRefPattern < TPZGeoPrism >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 7://cube
			{
				TPZGeoElRefPattern < TPZGeoCube > *gel = new TPZGeoElRefPattern < TPZGeoCube >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			default:
			{
				PZError << "TPZGeoMesh::CreateGeoElement type element not exists:"
                << " type = " << type << std::endl;
				return NULL;
			}
		}
	}
	//return NULL;
}